

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

int Bdc_DecomposeOr(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  int local_40;
  int local_3c;
  int nRightVars;
  int nLeftVars;
  int v;
  uint uSupportRem;
  Bdc_Isf_t *pIsfR_local;
  Bdc_Isf_t *pIsfL_local;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  local_3c = 1;
  local_40 = 1;
  Bdc_IsfStart(p,pIsfL);
  Bdc_IsfStart(p,pIsfR);
  uVar2 = Kit_TruthSupport(pIsf->puOn,p->nVars);
  uVar3 = Kit_TruthSupport(pIsf->puOff,p->nVars);
  if (uVar2 != uVar3) {
    __assert_fail("Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                  ,0x150,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)");
  }
  uVar2 = pIsf->uSupp;
  uVar3 = Kit_TruthSupport(pIsf->puOn,p->nVars);
  if (uVar2 != uVar3) {
    __assert_fail("pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                  ,0x151,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)");
  }
  iVar4 = Bdc_DecomposeFindInitialVarSet(p,pIsf,pIsfL,pIsfR);
  if (iVar4 == 0) {
    p_local._4_4_ = Bdc_DecomposeWeakOr(p,pIsf,pIsfL,pIsfR);
  }
  else {
    Kit_TruthExistSet(p->puTemp1,pIsf->puOff,p->nVars,pIsfL->uUniq);
    Kit_TruthExistSet(p->puTemp2,pIsf->puOff,p->nVars,pIsfR->uUniq);
    uVar2 = pIsf->uSupp;
    uVar3 = pIsfL->uUniq;
    uVar1 = pIsfR->uUniq;
    for (nRightVars = 0; nRightVars < p->nVars; nRightVars = nRightVars + 1) {
      bVar5 = (byte)nRightVars;
      if ((uVar2 & (uVar3 ^ 0xffffffff) & (uVar1 ^ 0xffffffff) & 1 << (bVar5 & 0x1f)) != 0) {
        Kit_TruthExistNew(p->puTemp3,p->puTemp1,p->nVars,nRightVars);
        Kit_TruthExistNew(p->puTemp4,p->puTemp2,p->nVars,nRightVars);
        if (local_3c < local_40) {
          iVar4 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp3,p->puTemp2,p->nVars);
          if (iVar4 == 0) {
            iVar4 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp4,p->puTemp1,p->nVars);
            if (iVar4 != 0) {
              pIsfR->uUniq = 1 << (bVar5 & 0x1f) | pIsfR->uUniq;
              local_40 = local_40 + 1;
              Kit_TruthCopy(p->puTemp2,p->puTemp4,p->nVars);
            }
          }
          else {
            pIsfL->uUniq = 1 << (bVar5 & 0x1f) | pIsfL->uUniq;
            local_3c = local_3c + 1;
            Kit_TruthCopy(p->puTemp1,p->puTemp3,p->nVars);
          }
        }
        else {
          iVar4 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp4,p->puTemp1,p->nVars);
          if (iVar4 == 0) {
            iVar4 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp3,p->puTemp2,p->nVars);
            if (iVar4 != 0) {
              pIsfL->uUniq = 1 << (bVar5 & 0x1f) | pIsfL->uUniq;
              local_3c = local_3c + 1;
              Kit_TruthCopy(p->puTemp1,p->puTemp3,p->nVars);
            }
          }
          else {
            pIsfR->uUniq = 1 << (bVar5 & 0x1f) | pIsfR->uUniq;
            local_40 = local_40 + 1;
            Kit_TruthCopy(p->puTemp2,p->puTemp4,p->nVars);
          }
        }
      }
    }
    Kit_TruthAnd(pIsfL->puOn,pIsf->puOn,p->puTemp1,p->nVars);
    Kit_TruthExistSet(pIsfL->puOn,pIsfL->puOn,p->nVars,pIsfR->uUniq);
    Kit_TruthCopy(pIsfL->puOff,p->puTemp2,p->nVars);
    iVar4 = Kit_TruthIsConst0(pIsfL->puOn,p->nVars);
    if (iVar4 != 0) {
      __assert_fail("!Kit_TruthIsConst0(pIsfL->puOn, p->nVars)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x19a,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    iVar4 = Kit_TruthIsConst0(pIsfL->puOff,p->nVars);
    if (iVar4 != 0) {
      __assert_fail("!Kit_TruthIsConst0(pIsfL->puOff, p->nVars)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x19b,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    Kit_TruthAnd(pIsfR->puOn,pIsf->puOn,p->puTemp2,p->nVars);
    Kit_TruthExistSet(pIsfR->puOn,pIsfR->puOn,p->nVars,pIsfL->uUniq);
    Kit_TruthCopy(pIsfR->puOff,p->puTemp1,p->nVars);
    iVar4 = Kit_TruthIsConst0(pIsfR->puOn,p->nVars);
    if (iVar4 != 0) {
      __assert_fail("!Kit_TruthIsConst0(pIsfR->puOn, p->nVars)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x1a8,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    iVar4 = Kit_TruthIsConst0(pIsfR->puOff,p->nVars);
    if (iVar4 != 0) {
      __assert_fail("!Kit_TruthIsConst0(pIsfR->puOff, p->nVars)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x1a9,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    if (pIsfL->uUniq == 0) {
      __assert_fail("pIsfL->uUniq",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x1ac,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    if (pIsfR->uUniq == 0) {
      __assert_fail("pIsfR->uUniq",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcDec.c"
                    ,0x1ad,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    p_local._4_4_ = Bdc_DecomposeGetCost(p,local_3c,local_40);
  }
  return p_local._4_4_;
}

Assistant:

int Bdc_DecomposeOr( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    unsigned uSupportRem;
	int v, nLeftVars = 1, nRightVars = 1; 
    // clean the var sets
    Bdc_IsfStart( p, pIsfL );
    Bdc_IsfStart( p, pIsfR );
    // check that the support is correct
    assert( Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars) );
    assert( pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars) );
    // find initial variable sets
    if ( !Bdc_DecomposeFindInitialVarSet( p, pIsf, pIsfL, pIsfR ) )
        return Bdc_DecomposeWeakOr( p, pIsf, pIsfL, pIsfR );
    // prequantify the variables in the offset
    Kit_TruthExistSet( p->puTemp1, pIsf->puOff, p->nVars, pIsfL->uUniq ); 
    Kit_TruthExistSet( p->puTemp2, pIsf->puOff, p->nVars, pIsfR->uUniq );
    // go through the remaining variables
    uSupportRem = pIsf->uSupp & ~pIsfL->uUniq & ~pIsfR->uUniq;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( (uSupportRem & (1 << v)) == 0 )
            continue;
        // prequantify this variable
        Kit_TruthExistNew( p->puTemp3, p->puTemp1, p->nVars, v );
        Kit_TruthExistNew( p->puTemp4, p->puTemp2, p->nVars, v );
		if ( nLeftVars < nRightVars )
		{
//			if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
//			if ( VerifyORCondition( dd, pF->Q, pF->R, pL->V, pR->V, VarNew ) )
			if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
			{
//				pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
				nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
			}
//			else if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
			else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
			{
//				pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
				nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
			}
		}
		else
		{
//			if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
			if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
			{
//				pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
				nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
			}
//			else if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
			else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
			{
//				pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
				nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
			}
		}
    }

	// derive the functions Q and R for the left branch
//	pL->Q = bdd_appex( pF->Q, bdd_exist( pF->R, pL->V ), bddop_and, pR->V );
//	pL->R = bdd_exist( pF->R, pR->V );

//	Temp = Cudd_bddExistAbstract( dd, pF->R, pL->V );      Cudd_Ref( Temp );
//	pL->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pR->V ); Cudd_Ref( pL->Q );
//	Cudd_RecursiveDeref( dd, Temp );
//	pL->R = Cudd_bddExistAbstract( dd, pF->R, pR->V );     Cudd_Ref( pL->R );

    Kit_TruthAnd( pIsfL->puOn, pIsf->puOn, p->puTemp1, p->nVars );
    Kit_TruthExistSet( pIsfL->puOn, pIsfL->puOn, p->nVars, pIsfR->uUniq );
    Kit_TruthCopy( pIsfL->puOff, p->puTemp2, p->nVars );

//	assert( pL->Q != b0 );
//	assert( pL->R != b0 );
//	assert( Cudd_bddIteConstant( dd, pL->Q, pL->R, b0 ) == b0 );
    assert( !Kit_TruthIsConst0(pIsfL->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfL->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfL->puOn, pIsfL->puOff, p->nVars) );

	// derive the functions Q and R for the right branch
//	Temp = Cudd_bddExistAbstract( dd, pF->R, pR->V );      Cudd_Ref( Temp );
//	pR->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pL->V ); Cudd_Ref( pR->Q );
//	Cudd_RecursiveDeref( dd, Temp );
//	pR->R = Cudd_bddExistAbstract( dd, pF->R, pL->V );     Cudd_Ref( pR->R );

    Kit_TruthAnd( pIsfR->puOn, pIsf->puOn, p->puTemp2, p->nVars );
    Kit_TruthExistSet( pIsfR->puOn, pIsfR->puOn, p->nVars, pIsfL->uUniq );
    Kit_TruthCopy( pIsfR->puOff, p->puTemp1, p->nVars );

    assert( !Kit_TruthIsConst0(pIsfR->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfR->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfR->puOn, pIsfR->puOff, p->nVars) );

    assert( pIsfL->uUniq );
    assert( pIsfR->uUniq );
	return Bdc_DecomposeGetCost( p, nLeftVars, nRightVars );		
}